

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdns.cpp
# Opt level: O0

void __thiscall cdns::cdns(cdns *this)

{
  cdns *this_local;
  
  cdnsPreamble::cdnsPreamble(&this->preamble);
  cdnsBlock::cdnsBlock(&this->block);
  this->first_block_start_us = 0;
  this->index_offset = 0;
  this->buf = (uint8_t *)0x0;
  this->buf_size = 0;
  this->buf_read = 0;
  this->buf_parsed = 0;
  this->end_of_file = false;
  this->preamble_parsed = false;
  this->file_head_undef = false;
  this->block_list_undef = false;
  this->nb_blocks_present = 0;
  this->nb_blocks_read = 0;
  return;
}

Assistant:

cdns::cdns():
    first_block_start_us(0),
    index_offset(0),
    buf(NULL),
    buf_size(0),
    buf_read(0),
    buf_parsed(0),
    end_of_file(false),
    preamble_parsed(false),
    file_head_undef(false),
    block_list_undef(false),
    nb_blocks_present(0),
    nb_blocks_read(0)
{
}